

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

bool __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
operator()(ShadedRenderer<ImPlot::GetterYs<double>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
           *this,ImDrawList *DrawList,ImRect *param_2,ImVec2 *uv,int prim)

{
  float fVar1;
  float fVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  int iVar7;
  GetterYs<double> *pGVar8;
  TransformerLogLog *pTVar9;
  ImPlotPlot *pIVar10;
  GetterYRef *pGVar11;
  ImDrawVert *pIVar12;
  uint *puVar13;
  ImVec2 IVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  ImVec2 IVar18;
  ImPlotContext *pIVar19;
  ImPlotContext *pIVar20;
  uint uVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  
  pIVar19 = GImPlot;
  pGVar8 = this->Getter1;
  pTVar9 = this->Transformer;
  dVar17 = (double)(prim + 1);
  iVar7 = pGVar8->Count;
  dVar3 = *(double *)
           ((long)pGVar8->Ys +
           (long)(((prim + 1 + pGVar8->Offset) % iVar7 + iVar7) % iVar7) * (long)pGVar8->Stride);
  dVar15 = log10((pGVar8->XScale * dVar17 + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar4 = pIVar19->LogDenX;
  pIVar10 = pIVar19->CurrentPlot;
  dVar5 = (pIVar10->XAxis).Range.Min;
  dVar6 = (pIVar10->XAxis).Range.Max;
  dVar16 = log10(dVar3 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  pIVar20 = GImPlot;
  iVar7 = pTVar9->YAxis;
  pIVar10 = pIVar19->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar7].Range.Min;
  fVar25 = (float)((((double)(float)(dVar15 / dVar4) * (dVar6 - dVar5) + dVar5) -
                   (pIVar10->XAxis).Range.Min) * pIVar19->Mx +
                  (double)pIVar19->PixelRange[iVar7].Min.x);
  fVar23 = (float)((((double)(float)(dVar16 / pIVar19->LogDenY[iVar7]) *
                     (pIVar10->YAxis[iVar7].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar19->My[iVar7] + (double)pIVar19->PixelRange[iVar7].Min.y);
  pGVar11 = this->Getter2;
  pTVar9 = this->Transformer;
  dVar3 = pGVar11->YRef;
  dVar15 = log10((dVar17 * pGVar11->XScale + pGVar11->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min)
  ;
  dVar4 = pIVar20->LogDenX;
  pIVar10 = pIVar20->CurrentPlot;
  dVar5 = (pIVar10->XAxis).Range.Min;
  dVar6 = (pIVar10->XAxis).Range.Max;
  dVar16 = log10(dVar3 / pIVar10->YAxis[pTVar9->YAxis].Range.Min);
  iVar7 = pTVar9->YAxis;
  pIVar10 = pIVar20->CurrentPlot;
  dVar3 = pIVar10->YAxis[iVar7].Range.Min;
  fVar22 = (float)((((double)(float)(dVar15 / dVar4) * (dVar6 - dVar5) + dVar5) -
                   (pIVar10->XAxis).Range.Min) * pIVar20->Mx +
                  (double)pIVar20->PixelRange[iVar7].Min.x);
  fVar27 = (float)((((double)(float)(dVar16 / pIVar20->LogDenY[iVar7]) *
                     (pIVar10->YAxis[iVar7].Range.Max - dVar3) + dVar3) - dVar3) *
                   pIVar20->My[iVar7] + (double)pIVar20->PixelRange[iVar7].Min.y);
  fVar24 = (this->P12).x;
  fVar26 = fVar24 - fVar22;
  fVar29 = (this->P11).x;
  fVar1 = (this->P11).y;
  fVar2 = (this->P12).y;
  fVar30 = fVar29 * fVar23 - fVar25 * fVar1;
  fVar24 = fVar24 * fVar27 - fVar22 * fVar2;
  fVar29 = fVar29 - fVar25;
  fVar28 = fVar29 * (fVar2 - fVar27) - fVar26 * (fVar1 - fVar23);
  DrawList->_VtxWritePtr->pos = this->P11;
  DrawList->_VtxWritePtr->uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12->col = this->Col;
  pIVar12[1].pos.x = fVar25;
  pIVar12[1].pos.y = fVar23;
  DrawList->_VtxWritePtr[1].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[1].col = this->Col;
  IVar18.y = ((fVar2 - fVar27) * fVar30 - (fVar1 - fVar23) * fVar24) / fVar28;
  IVar18.x = (fVar30 * fVar26 - fVar29 * fVar24) / fVar28;
  pIVar12[2].pos = IVar18;
  DrawList->_VtxWritePtr[2].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[2].col = this->Col;
  pIVar12[3].pos = this->P12;
  DrawList->_VtxWritePtr[3].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[3].col = this->Col;
  IVar14.y = fVar27;
  IVar14.x = fVar22;
  pIVar12[4].pos = IVar14;
  DrawList->_VtxWritePtr[4].uv = *uv;
  pIVar12 = DrawList->_VtxWritePtr;
  pIVar12[4].col = this->Col;
  DrawList->_VtxWritePtr = pIVar12 + 5;
  puVar13 = DrawList->_IdxWritePtr;
  *puVar13 = DrawList->_VtxCurrentIdx;
  uVar21 = -(uint)(fVar2 < fVar1 && fVar23 < fVar27 || fVar1 < fVar2 && fVar27 < fVar23) & 1;
  puVar13[1] = DrawList->_VtxCurrentIdx + uVar21 + 1;
  puVar13[2] = DrawList->_VtxCurrentIdx + 3;
  puVar13[3] = DrawList->_VtxCurrentIdx + 1;
  puVar13[4] = (uVar21 ^ 3) + DrawList->_VtxCurrentIdx;
  puVar13[5] = DrawList->_VtxCurrentIdx + 4;
  DrawList->_IdxWritePtr = puVar13 + 6;
  DrawList->_VtxCurrentIdx = DrawList->_VtxCurrentIdx + 5;
  (this->P11).x = fVar25;
  (this->P11).y = fVar23;
  (this->P12).x = fVar22;
  (this->P12).y = fVar27;
  return true;
}

Assistant:

inline bool operator()(ImDrawList& DrawList, const ImRect& /*cull_rect*/, const ImVec2& uv, int prim) const {
        // TODO: Culling
        ImVec2 P21 = Transformer(Getter1(prim+1));
        ImVec2 P22 = Transformer(Getter2(prim+1));
        const int intersect = (P11.y > P12.y && P22.y > P21.y) || (P12.y > P11.y && P21.y > P22.y);
        ImVec2 intersection = Intersection(P11,P21,P12,P22);
        DrawList._VtxWritePtr[0].pos = P11;
        DrawList._VtxWritePtr[0].uv  = uv;
        DrawList._VtxWritePtr[0].col = Col;
        DrawList._VtxWritePtr[1].pos = P21;
        DrawList._VtxWritePtr[1].uv  = uv;
        DrawList._VtxWritePtr[1].col = Col;
        DrawList._VtxWritePtr[2].pos = intersection;
        DrawList._VtxWritePtr[2].uv  = uv;
        DrawList._VtxWritePtr[2].col = Col;
        DrawList._VtxWritePtr[3].pos = P12;
        DrawList._VtxWritePtr[3].uv  = uv;
        DrawList._VtxWritePtr[3].col = Col;
        DrawList._VtxWritePtr[4].pos = P22;
        DrawList._VtxWritePtr[4].uv  = uv;
        DrawList._VtxWritePtr[4].col = Col;
        DrawList._VtxWritePtr += 5;
        DrawList._IdxWritePtr[0] = (ImDrawIdx)(DrawList._VtxCurrentIdx);
        DrawList._IdxWritePtr[1] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1 + intersect);
        DrawList._IdxWritePtr[2] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3);
        DrawList._IdxWritePtr[3] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 1);
        DrawList._IdxWritePtr[4] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 3 - intersect);
        DrawList._IdxWritePtr[5] = (ImDrawIdx)(DrawList._VtxCurrentIdx + 4);
        DrawList._IdxWritePtr += 6;
        DrawList._VtxCurrentIdx += 5;
        P11 = P21;
        P12 = P22;
        return true;
    }